

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_global(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_bif_desc *pvVar7;
  CTcSymFunc *this_00;
  vm_val_t *pvVar8;
  size_t sVar9;
  uint uVar10;
  tc_metaclass_t meta;
  vm_val_t symval;
  CVmFuncPtr fp;
  vm_val_t symstr;
  
  if (this->globals_ == 0) {
    this_00 = (CTcSymFunc *)0x0;
  }
  else {
    this_00 = (CTcSymFunc *)0x0;
    symstr.val.obj = CVmObjString::create(0,sym,len);
    pvVar8 = sp_;
    symstr.typ = VM_OBJ;
    aVar3._4_4_ = symstr.val._4_4_;
    aVar3.obj = symstr.val.obj;
    pvVar4 = sp_ + 1;
    *(ulong *)sp_ = CONCAT44(symstr._4_4_,5);
    sp_ = pvVar4;
    pvVar8->val = aVar3;
    uVar10 = this->globals_;
    pvVar8 = &symval;
    CVmObject::index_val_ov
              ((CVmObject *)(G_obj_table_X.pages_[uVar10 >> 0xc] + (uVar10 & 0xfff)),pvVar8,uVar10,
               &symstr);
    pvVar4 = sp_;
    aVar2.bifptr.func_idx = symval.val.bifptr.func_idx;
    aVar2.prop = symval.val.prop;
    aVar2._4_4_ = symval.val._4_4_;
    pvVar5 = sp_ + 1;
    *(ulong *)sp_ = CONCAT44(symval._4_4_,symval.typ);
    sp_ = pvVar5;
    pvVar4->val = aVar2;
    switch(symval.typ) {
    case VM_OBJ:
      iVar6 = CVmObjClass::is_intcls_obj(CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
      uVar10 = symval.val.prop & 0xfff;
      pCVar1 = G_obj_table_X.pages_[CONCAT22(symval.val.bifptr.func_idx,symval.val.prop) >> 0xc];
      if (iVar6 == 0) {
        meta = TC_META_TADSOBJ;
        sVar9 = 0;
        iVar6 = (**(code **)(*(long *)&pCVar1[uVar10].ptr_ + 0x70))(pCVar1 + uVar10);
        if (iVar6 == 0) {
          iVar6 = CVmObjTads::is_tadsobj_obj(CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
          if (iVar6 == 0) {
            iVar6 = CVmObjGramProd::is_gramprod_obj
                              (CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
            if (iVar6 == 0) {
              iVar6 = CVmObjDict::is_dictionary_obj
                                (CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
              if (iVar6 == 0) {
                iVar6 = CVmObjIntClsMod::is_intcls_mod_obj
                                  (CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
                meta = -(uint)(iVar6 == 0) | TC_META_ICMOD;
              }
              else {
                meta = TC_META_DICT;
              }
            }
            else {
              meta = TC_META_GRAMPROD;
            }
          }
          this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,sVar9);
          CTcSymObj::CTcSymObj
                    ((CTcSymObj *)this_00,sym,len,0,
                     CONCAT22(symval.val.bifptr.func_idx,symval.val.prop),0,meta,(CTcDictEntry *)0x0
                    );
        }
        else {
          this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,sVar9);
          CTcSymFuncObj::CTcSymFuncObj
                    ((CTcSymFuncObj *)this_00,sym,len,0,
                     CONCAT22(symval.val.bifptr.func_idx,symval.val.prop),0,TC_META_UNKNOWN,
                     (CTcDictEntry *)0x0);
        }
      }
      else {
        this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x60,(size_t)pvVar8);
        CTcSymMetaclass::CTcSymMetaclass
                  ((CTcSymMetaclass *)this_00,sym,len,0,**(int **)((long)&pCVar1[uVar10].ptr_ + 8),
                   CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
      }
      break;
    case VM_PROP:
      this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x30,(size_t)pvVar8);
      CTcSymProp::CTcSymProp((CTcSymProp *)this_00,sym,len,0,symval.val.prop);
      break;
    case VM_FUNCPTR:
      sVar9 = (size_t)CONCAT22(symval.val.bifptr.func_idx,symval.val.prop);
      CVmFuncPtr::CVmFuncPtr(&fp,CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
      this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x98,sVar9);
      CTcSymFunc::CTcSymFunc
                (this_00,sym,len,0,*fp.p_ & 0x7f,(uint)fp.p_[1],(uint)(*fp.p_ >> 7),1,0,0,0,1);
      (*(this_00->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
        super_CVmHashEntry._vptr_CVmHashEntry[0x22])
                (this_00,(ulong)CONCAT22(symval.val.bifptr.func_idx,symval.val.prop));
      break;
    case VM_ENUM:
      this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)pvVar8);
      CTcSymEnum::CTcSymEnum
                ((CTcSymEnum *)this_00,sym,len,0,
                 (ulong)CONCAT22(symval.val.bifptr.func_idx,symval.val.prop),0);
      break;
    case VM_BIFPTR:
      sVar9 = (size_t)symval.val.prop;
      pvVar7 = CVmBifTable::get_desc
                         (G_bif_table_X,(uint)symval.val.prop,(uint)symval.val.bifptr.func_idx);
      if ((pvVar7 == (vm_bif_desc *)0x0) || (pvVar7->func == (_func_void_uint *)0x0)) {
        this_00 = (CTcSymFunc *)0x0;
      }
      else {
        this_00 = (CTcSymFunc *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,sVar9);
        CTcSymBif::CTcSymBif
                  ((CTcSymBif *)this_00,sym,len,0,symval.val.prop,symval.val.bifptr.func_idx,1,
                   pvVar7->min_argc,pvVar7->opt_argc + pvVar7->min_argc,pvVar7->varargs);
      }
    }
    sp_ = sp_ + -2;
  }
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *find_global(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (globals_ == VM_INVALID_OBJ)
            return 0;

        /* presume we won't find a symbol */
        CTcSymbol *ret = 0;
        
        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* create a string for the symbol name; stack it for gc protection */
        vm_val_t symstr;
        symstr.set_obj(CVmObjString::create(vmg_ FALSE, sym, len));
        G_stk->push(&symstr);

        /* look up the symbol string in the table */
        vm_val_t symval;
        vm_objp(vmg_ globals_)->index_val_ov(vmg_ &symval, globals_, &symstr);
        G_stk->push(&symval);

        /* check what we found */
        switch (symval.typ)
        {
        case VM_OBJ:
            /* it's an object - map it to CTcSymObj or CTcSymMetaclass */
            if (CVmObjClass::is_intcls_obj(vmg_ symval.val.obj))
            {
                /* 
                 *   it's an IntrinsicClass object - this represents a
                 *   metaclass, so map it to a CTcSymMetaclass symbol 
                 */
                CVmObjClass *cl = (CVmObjClass *)vm_objp(vmg_ symval.val.obj);
                ret = new CTcSymMetaclass(sym, len, FALSE,
                                          cl->get_meta_idx(),
                                          symval.val.obj);
            }
            else if (vm_objp(vmg_ symval.val.obj)->get_invoker(vmg_ 0))
            {
                /* 
                 *   it's an invokable object - create a function-like object
                 *   symbol for it 
                 */
                ret = new CTcSymFuncObj(sym, len, FALSE, symval.val.obj,
                                        FALSE, TC_META_UNKNOWN, 0);
            }
            else
            {
                /* 
                 *   It's not an IntrinsicClass object, so it's a regular
                 *   CTcSymObj symbol.  Check for special metaclasses that
                 *   the compiler is aware of.  
                 */
                tc_metaclass_t meta = TC_META_UNKNOWN;

                if (CVmObjTads::is_tadsobj_obj(vmg_ symval.val.obj))
                    meta = TC_META_TADSOBJ;
                else if (CVmObjGramProd::is_gramprod_obj(vmg_ symval.val.obj))
                    meta = TC_META_GRAMPROD;
                else if (CVmObjDict::is_dictionary_obj(vmg_ symval.val.obj))
                    meta = TC_META_DICT;
                else if (CVmObjIntClsMod::is_intcls_mod_obj(vmg_ symval.val.obj))
                    meta = TC_META_ICMOD;

                /* create the object symbol */
                ret = new CTcSymObj(sym, len, FALSE, symval.val.obj,
                                    FALSE, meta, 0);
            }